

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *param_1,Hasher *h,VkFragmentShadingRateAttachmentInfoKHR *info)

{
  VkFragmentShadingRateAttachmentInfoKHR *info_local;
  Hasher *h_local;
  StateRecorder *param_0_local;
  
  if (info->pFragmentShadingRateAttachment == (VkAttachmentReference2 *)0x0) {
    Hasher::u32(h,0);
  }
  else {
    Hasher::u32(h,info->pFragmentShadingRateAttachment->attachment);
    Hasher::u32(h,info->pFragmentShadingRateAttachment->layout);
    Hasher::u32(h,info->pFragmentShadingRateAttachment->aspectMask);
    Hasher::u32(h,(info->shadingRateAttachmentTexelSize).width);
    Hasher::u32(h,(info->shadingRateAttachmentTexelSize).height);
    if (info->pFragmentShadingRateAttachment->pNext != (void *)0x0) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool hash_pnext_struct(const StateRecorder *,
                              Hasher &h,
                              const VkFragmentShadingRateAttachmentInfoKHR &info)
{
	if (info.pFragmentShadingRateAttachment)
	{
		h.u32(info.pFragmentShadingRateAttachment->attachment);
		h.u32(info.pFragmentShadingRateAttachment->layout);
		h.u32(info.pFragmentShadingRateAttachment->aspectMask);
		h.u32(info.shadingRateAttachmentTexelSize.width);
		h.u32(info.shadingRateAttachmentTexelSize.height);

		// Avoid potential stack overflow on intentionally broken input.
		// It is also meaningless, since the only pNext we can consider here
		// is stencil layout.
		if (info.pFragmentShadingRateAttachment->pNext)
			return false;
	}
	else
		h.u32(0);

	return true;
}